

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleColor(int count)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImGuiColorMod *pIVar3;
  ImVec4 *pIVar4;
  int in_EDI;
  ImGuiColorMod *backup;
  ImGuiContext *g;
  int local_4;
  
  pIVar2 = GImGui;
  local_4 = in_EDI;
  if ((GImGui->ColorStack).Size < in_EDI) {
    local_4 = (GImGui->ColorStack).Size;
  }
  for (; 0 < local_4; local_4 = local_4 + -1) {
    pIVar3 = ImVector<ImGuiColorMod>::back(&pIVar2->ColorStack);
    pIVar4 = (pIVar2->Style).Colors + pIVar3->Col;
    fVar1 = (pIVar3->BackupValue).y;
    pIVar4->x = (pIVar3->BackupValue).x;
    pIVar4->y = fVar1;
    fVar1 = (pIVar3->BackupValue).w;
    pIVar4->z = (pIVar3->BackupValue).z;
    pIVar4->w = fVar1;
    ImVector<ImGuiColorMod>::pop_back(&pIVar2->ColorStack);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    if (g.ColorStack.Size < count)
    {
        IM_ASSERT_USER_ERROR(g.ColorStack.Size > count, "Calling PopStyleColor() too many times: stack underflow.");
        count = g.ColorStack.Size;
    }
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorStack.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorStack.pop_back();
        count--;
    }
}